

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsParallel.h
# Opt level: O1

void highs::parallel::for_each<HEkkDual::chooseColumnSlice(HVectorBase<double>*)::__1&>
               (HighsInt start,HighsInt end,anon_class_32_4_b1b9b1f6 *f,HighsInt grainSize)

{
  uint32_t *puVar1;
  __atomic_base<int> _Var2;
  uint uVar3;
  uint32_t uVar4;
  element_type *peVar5;
  HighsSplitDeque *pHVar6;
  long *plVar7;
  ulong uVar8;
  int start_00;
  TaskGroup tg;
  TaskGroup local_40;
  
  if (end - start <= grainSize) {
    HEkkDual::chooseColumnSlice::anon_class_32_4_b1b9b1f6::operator()(f,start,end);
    return;
  }
  HighsTaskExecutor::threadLocalWorkerDequePtr::__tls_init();
  plVar7 = (long *)__tls_get_addr(&PTR_00449ef0);
  local_40.workerDeque = (HighsSplitDeque *)*plVar7;
  local_40.dequeHead = ((local_40.workerDeque)->ownerData).head;
  do {
    pHVar6 = local_40.workerDeque;
    start_00 = start + end >> 1;
    uVar3 = ((local_40.workerDeque)->ownerData).head;
    uVar8 = (ulong)uVar3;
    if (uVar8 < 0x2000) {
      ((local_40.workerDeque)->ownerData).head = uVar3 + 1;
      ((local_40.workerDeque)->taskArray)._M_elems[uVar8].metadata.stealer.
      super___atomic_base<unsigned_long>._M_i = 0;
      *(undefined ***)((local_40.workerDeque)->taskArray)._M_elems[uVar8].taskData =
           &PTR_operator___00449340;
      *(int *)(((local_40.workerDeque)->taskArray)._M_elems[uVar8].taskData + 8) = start_00;
      *(HighsInt *)(((local_40.workerDeque)->taskArray)._M_elems[uVar8].taskData + 0xc) = end;
      *(HighsInt *)(((local_40.workerDeque)->taskArray)._M_elems[uVar8].taskData + 0x10) = grainSize
      ;
      *(anon_class_32_4_b1b9b1f6 **)
       (((local_40.workerDeque)->taskArray)._M_elems[uVar8].taskData + 0x18) = f;
      if (((local_40.workerDeque)->ownerData).allStolenCopy == true) {
        uVar4 = ((local_40.workerDeque)->ownerData).head;
        ((local_40.workerDeque)->stealerData).ts.super___atomic_base<unsigned_long>._M_i =
             CONCAT44(uVar4 - 1,uVar4);
        ((local_40.workerDeque)->stealerData).allStolen._M_base._M_i = false;
        ((local_40.workerDeque)->ownerData).splitCopy = ((local_40.workerDeque)->ownerData).head;
        ((local_40.workerDeque)->ownerData).allStolenCopy = false;
        if ((((local_40.workerDeque)->splitRequest)._M_base._M_i & 1U) != 0) {
          ((local_40.workerDeque)->splitRequest)._M_base._M_i = false;
        }
        peVar5 = ((local_40.workerDeque)->ownerData).workerBunk.
                 super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        LOCK();
        _Var2._M_i = (peVar5->haveJobs).super___atomic_base<int>._M_i;
        (peVar5->haveJobs).super___atomic_base<int>._M_i =
             (peVar5->haveJobs).super___atomic_base<int>._M_i + 1;
        UNLOCK();
        if (_Var2._M_i < ((local_40.workerDeque)->ownerData).numWorkers + -1) {
          HighsSplitDeque::WorkerBunk::publishWork
                    (((local_40.workerDeque)->ownerData).workerBunk.
                     super___shared_ptr<HighsSplitDeque::WorkerBunk,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr,local_40.workerDeque);
        }
      }
      else {
        HighsSplitDeque::growShared(local_40.workerDeque);
      }
    }
    else {
      if ((((local_40.workerDeque)->ownerData).splitCopy < 0x2000) &&
         (((local_40.workerDeque)->ownerData).allStolenCopy == false)) {
        HighsSplitDeque::growShared(local_40.workerDeque);
      }
      puVar1 = &(pHVar6->ownerData).head;
      *puVar1 = *puVar1 + 1;
      for_each<HEkkDual::chooseColumnSlice(HVectorBase<double>*)::__1&>(start_00,end,f,grainSize);
    }
    end = start_00;
  } while (grainSize < start_00 - start);
  HEkkDual::chooseColumnSlice::anon_class_32_4_b1b9b1f6::operator()(f,start,start_00);
  TaskGroup::taskWait(&local_40);
  TaskGroup::~TaskGroup(&local_40);
  return;
}

Assistant:

void for_each(HighsInt start, HighsInt end, F&& f, HighsInt grainSize = 1) {
  if (end - start <= grainSize) {
    f(start, end);
  } else {
    TaskGroup tg;

    do {
      HighsInt split = (start + end) >> 1;
      tg.spawn([split, end, grainSize, &f]() {
        for_each(split, end, f, grainSize);
      });
      end = split;
    } while (end - start > grainSize);

    f(start, end);
    tg.taskWait();
  }
}